

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O2

char * fy_token_list_dump_format(fy_token_list *fytl,fy_token *fyt_highlight,char *buf,size_t bufsz)

{
  fy_token *pfVar1;
  int iVar2;
  fy_token *pfVar3;
  fy_token *pfVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (fytl == (fy_token_list *)0x0) {
    pfVar4 = (fy_token *)0x0;
  }
  else {
    pfVar3 = (fy_token *)(fytl->_lh).next;
    pfVar4 = (fy_token *)0x0;
    if (pfVar3 != (fy_token *)fytl) {
      pfVar4 = pfVar3;
    }
  }
  pcVar7 = buf;
  while (pfVar3 = pfVar4, pfVar3 != (fy_token *)0x0) {
    if (fytl == (fy_token_list *)0x0) {
      pfVar4 = (fy_token *)0x0;
    }
    else {
      pfVar1 = (fy_token *)(fytl->_lh).next;
      pfVar4 = (fy_token *)0x0;
      if (pfVar1 != (fy_token *)fytl) {
        pfVar4 = pfVar1;
      }
    }
    pcVar6 = "";
    if (pfVar3 != pfVar4) {
      pcVar6 = ",";
    }
    pcVar8 = "*";
    if (pfVar3 != fyt_highlight) {
      pcVar8 = "";
    }
    iVar2 = snprintf(pcVar7,(size_t)(buf + ((bufsz - 1) - (long)pcVar7)),"%s%s",pcVar6,pcVar8);
    pcVar7 = pcVar7 + iVar2;
    fy_token_dump_format(pfVar3,pcVar7,(size_t)(buf + ((bufsz - 1) - (long)pcVar7)));
    sVar5 = strlen(pcVar7);
    pcVar7 = pcVar7 + sVar5;
    pfVar4 = (fy_token *)0x0;
    if ((fytl != (fy_token_list *)0x0) &&
       (pfVar4 = (fy_token *)(pfVar3->node).next, pfVar4 == (fy_token *)fytl)) {
      pfVar4 = (fy_token *)0x0;
    }
  }
  *pcVar7 = '\0';
  return buf;
}

Assistant:

char *fy_token_list_dump_format(struct fy_token_list *fytl,
                                struct fy_token *fyt_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_token *fyt;

    s = buf;
    e = buf + bufsz - 1;
    for (fyt = fy_token_list_first(fytl); fyt; fyt = fy_token_next(fytl, fyt)) {

        s += snprintf(s, e - s, "%s%s",
                      fyt != fy_token_list_first(fytl) ? "," : "",
                      fyt_highlight == fyt ? "*" : "");

        fy_token_dump_format(fyt, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}